

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

void updateOutInIndex(HighsIndexCollection *index_collection,HighsInt *out_from_ix,
                     HighsInt *out_to_ix,HighsInt *in_from_ix,HighsInt *in_to_ix,
                     HighsInt *current_set_entry)

{
  int iVar1;
  const_reference pvVar2;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  HighsInt ix_2;
  HighsInt ix_1;
  HighsInt ix;
  HighsInt set_entry;
  HighsInt current_set_entry0;
  int local_44;
  int local_40;
  int local_38;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    if ((*(byte *)(in_RDI + 4) & 1) == 0) {
      *in_RSI = *in_R8 + 1;
      *in_RDX = *in_RDI + -1;
      local_40 = *in_R8;
      do {
        iVar1 = local_40;
        local_40 = iVar1 + 1;
        if (*in_RDI <= local_40) goto LAB_007efcf1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_40);
      } while (*pvVar2 != 0);
      *in_RDX = iVar1;
LAB_007efcf1:
      *in_RCX = *in_RDX + 1;
      *in_R8 = *in_RDI + -1;
      local_44 = *in_RDX;
      do {
        iVar1 = local_44;
        local_44 = iVar1 + 1;
        if (*in_RDI <= local_44) {
          return;
        }
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_44);
      } while (*pvVar2 == 0);
      *in_R8 = iVar1;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)*in_R9);
      *in_RSI = *pvVar2;
      *in_RDX = *in_RSI;
      *in_R9 = *in_R9 + 1;
      local_38 = *in_R9;
      while ((local_38 < in_RDI[5] &&
             (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_38),
             *pvVar2 <= *in_RDX + 1))) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)*in_R9);
        *in_RDX = *pvVar2;
        *in_R9 = *in_R9 + 1;
        local_38 = local_38 + 1;
      }
      *in_RCX = *in_RDX + 1;
      if (*in_R9 < in_RDI[5]) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)*in_R9);
        *in_R8 = *pvVar2 + -1;
      }
      else {
        *in_R8 = *in_RDI + -1;
      }
    }
  }
  else {
    *in_RSI = in_RDI[2];
    *in_RDX = in_RDI[3];
    *in_RCX = in_RDI[3] + 1;
    *in_R8 = *in_RDI + -1;
  }
  return;
}

Assistant:

void updateOutInIndex(const HighsIndexCollection& index_collection,
                      HighsInt& out_from_ix, HighsInt& out_to_ix,
                      HighsInt& in_from_ix, HighsInt& in_to_ix,
                      HighsInt& current_set_entry) {
  if (index_collection.is_interval_) {
    out_from_ix = index_collection.from_;
    out_to_ix = index_collection.to_;
    in_from_ix = index_collection.to_ + 1;
    in_to_ix = index_collection.dimension_ - 1;
  } else if (index_collection.is_set_) {
    out_from_ix = index_collection.set_[current_set_entry];
    out_to_ix = out_from_ix;
    current_set_entry++;
    HighsInt current_set_entry0 = current_set_entry;
    for (HighsInt set_entry = current_set_entry0;
         set_entry < index_collection.set_num_entries_; set_entry++) {
      HighsInt ix = index_collection.set_[set_entry];
      if (ix > out_to_ix + 1) break;
      out_to_ix = index_collection.set_[current_set_entry];
      current_set_entry++;
    }
    in_from_ix = out_to_ix + 1;
    if (current_set_entry < index_collection.set_num_entries_) {
      in_to_ix = index_collection.set_[current_set_entry] - 1;
    } else {
      // Account for getting to the end of the set
      in_to_ix = index_collection.dimension_ - 1;
    }
  } else {
    out_from_ix = in_to_ix + 1;
    out_to_ix = index_collection.dimension_ - 1;
    for (HighsInt ix = in_to_ix + 1; ix < index_collection.dimension_; ix++) {
      if (!index_collection.mask_[ix]) {
        out_to_ix = ix - 1;
        break;
      }
    }
    in_from_ix = out_to_ix + 1;
    in_to_ix = index_collection.dimension_ - 1;
    for (HighsInt ix = out_to_ix + 1; ix < index_collection.dimension_; ix++) {
      if (index_collection.mask_[ix]) {
        in_to_ix = ix - 1;
        break;
      }
    }
  }
}